

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modules.cpp
# Opt level: O2

void module1(uint W)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  code *pcVar5;
  double dVar6;
  FlowBuilder FVar7;
  FlowBuilder FVar8;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  int iVar9;
  size_t repeat;
  bool bVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  int cnt;
  _Tuple_impl<0UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&> local_420;
  Task D;
  Task C;
  Task B;
  int local_3dc;
  Task E;
  Task m1_2;
  Task A;
  ResultBuilder DOCTEST_RB;
  int *local_340;
  undefined4 local_338;
  Task m1_1;
  shared_ptr<tf::WorkerInterface> local_328;
  Taskflow f1;
  Taskflow f0;
  Future<void> local_188;
  Executor executor;
  
  local_328.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_328.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_328);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_328.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&f0);
  FVar7 = f0.super_FlowBuilder;
  cnt = 0;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:18:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:18:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar7._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  FVar8 = f0.super_FlowBuilder;
  A._node = ((FVar7._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:19:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:19:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  FVar7 = f0.super_FlowBuilder;
  B._node = ((FVar8._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:20:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:20:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar7._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  FVar8 = f0.super_FlowBuilder;
  C._node = ((FVar7._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:21:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:21:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  D._node = ((FVar8._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:22:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:22:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)f0.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  E._node = ((f0.super_FlowBuilder._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  tf::Node::_precede(A._node,B._node);
  tf::Node::_precede(B._node,C._node);
  tf::Node::_precede(C._node,D._node);
  tf::Node::_precede(D._node,E._node);
  tf::Taskflow::Taskflow(&f1);
  FVar7 = f1.super_FlowBuilder;
  local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<4UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
           super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)&cnt;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:33:5)>
               ::_M_invoke;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:33:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 1;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar7._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_420);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_420);
  FVar8 = f1.super_FlowBuilder;
  pNVar1 = ((FVar7._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<4UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
           super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)&cnt;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:34:5)>
               ::_M_invoke;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:34:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 1;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_420);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_420);
  FVar7 = f1.super_FlowBuilder;
  pNVar2 = ((FVar8._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<4UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
           super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)&cnt;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:35:5)>
               ::_M_invoke;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:35:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 1;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar7._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_420);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_420);
  FVar8 = f1.super_FlowBuilder;
  pNVar3 = ((FVar7._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<4UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
           super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)&cnt;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:36:5)>
               ::_M_invoke;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:36:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 1;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_420);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_420);
  FVar7 = f1.super_FlowBuilder;
  pNVar4 = ((FVar8._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<4UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
           super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_420.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)&cnt;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:37:5)>
               ::_M_invoke;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:37:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 1;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar7._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_420);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_420);
  DOCTEST_RB.super_AssertData.m_test_case =
       (TestCaseData *)
       ((FVar7._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl = (_Head_base<4UL,_tf::Task_&,_false>)&E;
  local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
  _M_head_impl = &D;
  local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Head_base<2UL,_tf::Task_&,_false>._M_head_impl = &C;
  local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Head_base<1UL,_tf::Task_&,_false>._M_head_impl = &B;
  local_420.super__Head_base<0UL,_tf::Task_&,_false>._M_head_impl = &A;
  DOCTEST_RB.super_AssertData._8_8_ = pNVar4;
  DOCTEST_RB.super_AssertData.m_file = (char *)pNVar3;
  DOCTEST_RB.super_AssertData._24_8_ = pNVar2;
  DOCTEST_RB.super_AssertData.m_expr = (char *)pNVar1;
  std::_Tuple_impl<0ul,tf::Task&,tf::Task&,tf::Task&,tf::Task&,tf::Task&>::
  _M_assign<tf::Task,tf::Task,tf::Task,tf::Task,tf::Task>
            (&local_420,
             (_Tuple_impl<0UL,_tf::Task,_tf::Task,_tf::Task,_tf::Task,_tf::Task> *)&DOCTEST_RB);
  tf::Node::_precede(A._node,B._node);
  tf::Node::_precede(B._node,C._node);
  tf::Node::_precede(C._node,D._node);
  tf::Node::_precede(D._node,E._node);
  tf::FlowBuilder::composed_of<tf::Taskflow>((FlowBuilder *)&m1_1,&f1);
  tf::Node::_precede(E._node,m1_1._node);
  tf::Executor::run((Future<void> *)&DOCTEST_RB,&executor,&f1);
  std::future<void>::get((future<void> *)&DOCTEST_RB);
  tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB);
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData._71_2_ = 0x17;
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_338 = 0xc;
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0x2f;
  DOCTEST_RB.super_AssertData.m_expr = "cnt == 10";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_340 = &cnt;
  m1_2._node._0_4_ = 10;
  doctest::detail::Expression_lhs<int_const&>::operator==
            ((Result *)&local_420,(Expression_lhs<int_const&> *)&local_340,(int *)&m1_2);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,(Result *)&local_420);
  doctest::String::~String
            ((String *)
             &local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
              super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
              super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
              super__Head_base<3UL,_tf::Task_&,_false>);
  dVar6 = doctest::detail::ResultBuilder::log
                    (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (extraout_AL != '\0') {
    pcVar5 = (code *)swi(3);
    (*pcVar5)(SUB84(dVar6,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  cnt = 0;
  tf::Executor::run_n((Future<void> *)&DOCTEST_RB,&executor,&f1,100);
  std::future<void>::get((future<void> *)&DOCTEST_RB);
  tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB);
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData._71_2_ = 0x17;
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_338 = 0xc;
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0x33;
  DOCTEST_RB.super_AssertData.m_expr = "cnt == 10 * 100";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_340 = &cnt;
  m1_2._node._0_4_ = 1000;
  doctest::detail::Expression_lhs<int_const&>::operator==
            ((Result *)&local_420,(Expression_lhs<int_const&> *)&local_340,(int *)&m1_2);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,(Result *)&local_420);
  doctest::String::~String
            ((String *)
             &local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
              super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
              super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
              super__Head_base<3UL,_tf::Task_&,_false>);
  dVar6 = doctest::detail::ResultBuilder::log
                    (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  if (extraout_AL_00 != '\0') {
    pcVar5 = (code *)swi(3);
    (*pcVar5)(SUB84(dVar6,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  tf::FlowBuilder::composed_of<tf::Taskflow>((FlowBuilder *)&m1_2,&f1);
  tf::Node::_precede(m1_1._node,(Node *)CONCAT44(m1_2._node._4_4_,m1_2._node._0_4_));
  iVar9 = 0;
  for (repeat = 0; cnt = 0, repeat != 100; repeat = repeat + 1) {
    tf::Executor::run_n((Future<void> *)&DOCTEST_RB.super_AssertData,&executor,&f1,repeat);
    std::future<void>::get((future<void> *)&DOCTEST_RB.super_AssertData);
    tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_338 = 0xc;
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x3b;
    DOCTEST_RB.super_AssertData.m_expr = "cnt == 15*n";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_340 = &cnt;
    local_3dc = iVar9;
    doctest::detail::Expression_lhs<int_const&>::operator==
              ((Result *)&local_420,(Expression_lhs<int_const&> *)&local_340,&local_3dc);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)&DOCTEST_RB.super_AssertData,(Result *)&local_420);
    doctest::String::~String
              ((String *)
               &local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                super__Head_base<3UL,_tf::Task_&,_false>);
    dVar6 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                       (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    if (extraout_AL_01 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)(SUB84(dVar6,0));
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    iVar9 = iVar9 + 0xf;
  }
  iVar9 = 100;
  while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
    tf::Executor::run(&local_188,&executor,&f1);
    tf::Future<void>::~Future(&local_188);
  }
  tf::Executor::wait_for_all(&executor);
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData._71_2_ = 0x17;
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_338 = 0xc;
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0x45;
  DOCTEST_RB.super_AssertData.m_expr = "cnt == 1500";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_340 = &cnt;
  local_3dc = 0x5dc;
  doctest::detail::Expression_lhs<int_const&>::operator==
            ((Result *)&local_420,(Expression_lhs<int_const&> *)&local_340,&local_3dc);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,(Result *)&local_420);
  doctest::String::~String
            ((String *)
             &local_420.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
              super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
              super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
              super__Head_base<3UL,_tf::Task_&,_false>);
  dVar6 = doctest::detail::ResultBuilder::log
                    (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
  if (extraout_AL_02 != '\0') {
    pcVar5 = (code *)swi(3);
    (*pcVar5)(SUB84(dVar6,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  tf::Taskflow::~Taskflow(&f1);
  tf::Taskflow::~Taskflow(&f0);
  tf::Executor::~Executor(&executor);
  return;
}

Assistant:

void module1(unsigned W) {

  tf::Executor executor(W);

  tf::Taskflow f0;

  int cnt {0};

  auto A = f0.emplace([&cnt](){ ++cnt; });
  auto B = f0.emplace([&cnt](){ ++cnt; });
  auto C = f0.emplace([&cnt](){ ++cnt; });
  auto D = f0.emplace([&cnt](){ ++cnt; });
  auto E = f0.emplace([&cnt](){ ++cnt; });

  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);

  tf::Taskflow f1;

  // module 1
  std::tie(A, B, C, D, E) = f1.emplace(
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; }
  );
  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);
  auto m1_1 = f1.composed_of(f0);
  E.precede(m1_1);

  executor.run(f1).get();
  REQUIRE(cnt == 10);

  cnt = 0;
  executor.run_n(f1, 100).get();
  REQUIRE(cnt == 10 * 100);

  auto m1_2 = f1.composed_of(f0);
  m1_1.precede(m1_2);

  for(int n=0; n<100; n++) {
    cnt = 0;
    executor.run_n(f1, n).get();
    REQUIRE(cnt == 15*n);
  }

  cnt = 0;
  for(int n=0; n<100; n++) {
    executor.run(f1);
  }

  executor.wait_for_all();

  REQUIRE(cnt == 1500);
}